

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

Point __thiscall
Patch::new_position_for_new_offset
          (Patch *this,uint32_t target_offset,
          function<unsigned_int_(Point)> *old_offset_for_old_position,
          function<Point_(unsigned_int)> *old_position_for_old_offset)

{
  Node *pNVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Point PVar5;
  uint uVar6;
  Point *traversal;
  Point *this_00;
  uint uVar7;
  uint32_t uVar8;
  Node *this_01;
  int local_88;
  uint local_84;
  Point node_new_start;
  Point node_old_start;
  Point preceding_old_position;
  Point preceding_new_position;
  PositionStackEntry left_ancestor_info;
  Point local_38;
  
  this_01 = this->root;
  PositionStackEntry::PositionStackEntry(&left_ancestor_info);
  Point::Point(&preceding_new_position);
  Point::Point(&preceding_old_position);
  local_84 = 0;
  local_88 = 0;
  do {
    while( true ) {
      if (this_01 == (Node *)0x0) goto LAB_00157f96;
      node_old_start =
           Point::traverse(&left_ancestor_info.old_end,&this_01->old_distance_from_left_ancestor);
      node_new_start =
           Point::traverse(&left_ancestor_info.new_end,&this_01->new_distance_from_left_ancestor);
      uVar2 = std::function<unsigned_int_(Point)>::operator()
                        (old_offset_for_old_position,node_old_start);
      pNVar1 = this_01->left;
      if (pNVar1 == (Node *)0x0) {
        uVar3 = 0;
        uVar8 = left_ancestor_info.total_old_text_size;
      }
      else {
        uVar3 = pNVar1->new_subtree_text_size;
        uVar8 = left_ancestor_info.total_old_text_size + pNVar1->old_subtree_text_size;
      }
      uVar7 = ((left_ancestor_info.total_new_text_size + uVar2) - uVar8) + uVar3;
      uVar3 = Node::new_text_size(this_01);
      uVar6 = uVar3 + uVar7;
      uVar3 = Node::old_text_size(this_01);
      if (target_offset < uVar6) break;
      local_88 = uVar3 + uVar2;
      preceding_old_position = Point::traverse(&node_old_start,&this_01->old_extent);
      preceding_new_position = Point::traverse(&node_new_start,&this_01->new_extent);
      local_84 = uVar6;
      if (this_01->right == (Node *)0x0) goto LAB_00157f96;
      left_ancestor_info.old_end = preceding_old_position;
      uVar8 = 0;
      uVar3 = 0;
      if (this_01->left != (Node *)0x0) {
        uVar3 = this_01->left->old_subtree_text_size;
      }
      left_ancestor_info.new_end = preceding_new_position;
      uVar4 = Node::old_text_size(this_01);
      left_ancestor_info.total_old_text_size =
           left_ancestor_info.total_old_text_size + uVar4 + uVar3;
      if (this_01->left != (Node *)0x0) {
        uVar8 = this_01->left->new_subtree_text_size;
      }
      uVar3 = Node::new_text_size(this_01);
      left_ancestor_info.total_new_text_size =
           left_ancestor_info.total_new_text_size + uVar3 + uVar8;
      this_01 = this_01->right;
    }
    if (uVar7 <= target_offset) {
      local_38 = Text::position_for_offset
                           ((this_01->new_text)._M_t.
                            super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
                            super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                            super__Head_base<0UL,_Text_*,_false>._M_head_impl,target_offset - uVar7,
                            0,true);
      traversal = &local_38;
      this_00 = &node_new_start;
      goto LAB_00157fc8;
    }
    this_01 = this_01->left;
  } while (this_01 != (Node *)0x0);
LAB_00157f96:
  node_new_start =
       std::function<Point_(unsigned_int)>::operator()
                 (old_position_for_old_offset,(target_offset - local_84) + local_88);
  node_old_start = Point::traversal(&node_new_start,&preceding_old_position);
  traversal = &node_old_start;
  this_00 = &preceding_new_position;
LAB_00157fc8:
  PVar5 = Point::traverse(this_00,traversal);
  return PVar5;
}

Assistant:

Point Patch::new_position_for_new_offset(uint32_t target_offset,
                                         function<uint32_t(Point)> old_offset_for_old_position,
                                         function<Point(uint32_t)> old_position_for_old_offset) const {
  const Node *node = root;
  Patch::PositionStackEntry left_ancestor_info;
  Point preceding_new_position, preceding_old_position;
  uint32_t preceding_old_offset = 0, preceding_new_offset = 0;

  while (node) {
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    uint32_t node_old_start_offset = old_offset_for_old_position(node_old_start);
    uint32_t node_new_start_offset = node_old_start_offset -
      left_ancestor_info.total_old_text_size +
      left_ancestor_info.total_new_text_size -
      node->left_subtree_old_text_size() +
      node->left_subtree_new_text_size();
    uint32_t node_new_end_offset = node_new_start_offset + node->new_text_size();
    uint32_t node_old_end_offset = node_old_start_offset + node->old_text_size();

    if (node_new_end_offset <= target_offset) {
      preceding_old_position = node_old_start.traverse(node->old_extent);
      preceding_new_position = node_new_start.traverse(node->new_extent);
      preceding_old_offset = node_old_end_offset;
      preceding_new_offset = node_new_end_offset;
      if (node->right) {
        left_ancestor_info.old_end = preceding_old_position;
        left_ancestor_info.new_end = preceding_new_position;
        left_ancestor_info.total_old_text_size += node->left_subtree_old_text_size() + node->old_text_size();
        left_ancestor_info.total_new_text_size += node->left_subtree_new_text_size() + node->new_text_size();
        node = node->right;
      } else {
        break;
      }
    } else if (node_new_start_offset <= target_offset) {
      return node_new_start
        .traverse(node->new_text->position_for_offset(target_offset - node_new_start_offset));
    } else {
      if (node->left) {
        node = node->left;
      } else {
        break;
      }
    }
  }

  return preceding_new_position.traverse(
    old_position_for_old_offset(
      preceding_old_offset + (target_offset - preceding_new_offset)
    ).traversal(preceding_old_position)
  );
}